

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownSystemName.cpp
# Opt level: O0

string_view slang::parsing::toString(KnownSystemName ksn)

{
  string_view sVar1;
  undefined4 in_EDI;
  undefined4 in_stack_ffffffffffffffe8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff0;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 7:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 8:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 10:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x11:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x12:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x13:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x14:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x15:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x16:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x17:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x18:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x19:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x1a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x1b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x1c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x1d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x1e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x1f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x20:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x21:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x22:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x23:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x24:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x25:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x26:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x27:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x28:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x29:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x2a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x2b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x2c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x2d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x2e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x2f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x30:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x31:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x32:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x33:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x34:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x35:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x36:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x37:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x38:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x39:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x3a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x3b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x3c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x3d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x3e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x3f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x40:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x41:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x42:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x43:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x44:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x45:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x46:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x47:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x48:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x49:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x4a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x4b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x4c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x4d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x4e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x4f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x50:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x51:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x52:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x53:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x54:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x55:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x56:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x57:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x58:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x59:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x5a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x5b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x5c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x5d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x5e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x5f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x60:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x61:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x62:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 99:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 100:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x65:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x66:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x67:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x68:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x69:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x6a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x6b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x6c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x6d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x6e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x6f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x70:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x71:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x72:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x73:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x74:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x75:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x76:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x77:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x78:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x79:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x7a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x7b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x7c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x7d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x7e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x7f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x80:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x81:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x82:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x83:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x84:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x85:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x86:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x87:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x88:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x89:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x8a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x8b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x8c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x8d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x8e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x8f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x90:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x91:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x92:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x93:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x94:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x95:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x96:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x97:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x98:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x99:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x9a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x9b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x9c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x9d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x9e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x9f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa7:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa8:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xa9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xaa:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xab:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xac:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xad:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xae:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xaf:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb7:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb8:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xb9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xba:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xbb:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xbc:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xbd:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xbe:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xbf:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 199:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 200:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xc9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xca:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xcb:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xcc:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xcd:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xce:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xcf:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd7:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd8:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xd9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xda:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xdb:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xdc:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xdd:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xde:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xdf:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe7:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe8:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xe9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xea:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xeb:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xec:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xed:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xee:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xef:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf0:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf5:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf6:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf7:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf8:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xf9:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xfa:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xfb:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xfc:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xfd:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xfe:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0xff:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x100:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x101:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x102:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x103:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x104:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x105:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x106:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x107:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x108:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x109:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10e:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x10f:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x110:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x111:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x112:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x113:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x114:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x115:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x116:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x117:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x118:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x119:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x11a:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x11b:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x11c:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  case 0x11d:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
  }
  sVar1._M_str = local_8;
  sVar1._M_len = (size_t)in_stack_fffffffffffffff0;
  return sVar1;
}

Assistant:

std::string_view toString(KnownSystemName ksn) {
    switch (ksn) {
        case KnownSystemName::Unknown: return "Unknown";
        case KnownSystemName::Bits: return "$bits";
        case KnownSystemName::Typename: return "$typename";
        case KnownSystemName::IsUnbounded: return "$isunbounded";
        case KnownSystemName::Low: return "$low";
        case KnownSystemName::High: return "$high";
        case KnownSystemName::Left: return "$left";
        case KnownSystemName::Right: return "$right";
        case KnownSystemName::Size: return "$size";
        case KnownSystemName::Increment: return "$increment";
        case KnownSystemName::Dimensions: return "$dimensions";
        case KnownSystemName::UnpackedDimensions: return "$unpacked_dimensions";
        case KnownSystemName::Rtoi: return "$rtoi";
        case KnownSystemName::Itor: return "$itor";
        case KnownSystemName::RealToBits: return "$realtobits";
        case KnownSystemName::BitsToReal: return "$bitstoreal";
        case KnownSystemName::ShortrealToBits: return "$shortrealtobits";
        case KnownSystemName::BitsToShortreal: return "$bitstoshortreal";
        case KnownSystemName::Signed: return "$signed";
        case KnownSystemName::Unsigned: return "$unsigned";
        case KnownSystemName::CoverageControl: return "$coverage_control";
        case KnownSystemName::CoverageGetMax: return "$coverage_get_max";
        case KnownSystemName::CoverageGet: return "$coverage_get";
        case KnownSystemName::CoverageMerge: return "$coverage_merge";
        case KnownSystemName::CoverageSave: return "$coverage_save";
        case KnownSystemName::GetCoverage: return "$get_coverage";
        case KnownSystemName::SetCoverageDbName: return "$set_coverage_db_name";
        case KnownSystemName::LoadCoverageDb: return "$load_coverage_db";
        case KnownSystemName::Clog2: return "$clog2";
        case KnownSystemName::CountBits: return "$countbits";
        case KnownSystemName::CountOnes: return "$countones";
        case KnownSystemName::OneHot: return "$onehot";
        case KnownSystemName::OneHot0: return "$onehot0";
        case KnownSystemName::IsUnknown: return "$isunknown";
        case KnownSystemName::Ln: return "$ln";
        case KnownSystemName::Log10: return "$log10";
        case KnownSystemName::Exp: return "$exp";
        case KnownSystemName::Sqrt: return "$sqrt";
        case KnownSystemName::Floor: return "$floor";
        case KnownSystemName::Ceil: return "$ceil";
        case KnownSystemName::Sin: return "$sin";
        case KnownSystemName::Cos: return "$cos";
        case KnownSystemName::Tan: return "$tan";
        case KnownSystemName::Asin: return "$asin";
        case KnownSystemName::Acos: return "$acos";
        case KnownSystemName::Atan: return "$atan";
        case KnownSystemName::Sinh: return "$sinh";
        case KnownSystemName::Cosh: return "$cosh";
        case KnownSystemName::Tanh: return "$tanh";
        case KnownSystemName::Asinh: return "$asinh";
        case KnownSystemName::Acosh: return "$acosh";
        case KnownSystemName::Atanh: return "$atanh";
        case KnownSystemName::Pow: return "$pow";
        case KnownSystemName::Atan2: return "$atan2";
        case KnownSystemName::Hypot: return "$hypot";
        case KnownSystemName::ValuePlusArgs: return "$value$plusargs";
        case KnownSystemName::GlobalClock: return "$global_clock";
        case KnownSystemName::SFormatF: return "$sformatf";
        case KnownSystemName::PSPrintF: return "$psprintf";
        case KnownSystemName::InferredClock: return "$inferred_clock";
        case KnownSystemName::InferredDisable: return "$inferred_disable";
        case KnownSystemName::Randomize: return "randomize";
        case KnownSystemName::Triggered: return "triggered";
        case KnownSystemName::Matched: return "matched";
        case KnownSystemName::FError: return "$ferror";
        case KnownSystemName::FGets: return "$fgets";
        case KnownSystemName::FScanf: return "$fscanf";
        case KnownSystemName::SScanf: return "$sscanf";
        case KnownSystemName::FRead: return "$fread";
        case KnownSystemName::FOpen: return "$fopen";
        case KnownSystemName::FClose: return "$fclose";
        case KnownSystemName::FGetC: return "$fgetc";
        case KnownSystemName::UngetC: return "$ungetc";
        case KnownSystemName::FTell: return "$ftell";
        case KnownSystemName::FSeek: return "$fseek";
        case KnownSystemName::Rewind: return "$rewind";
        case KnownSystemName::FFlush: return "$fflush";
        case KnownSystemName::FEof: return "$feof";
        case KnownSystemName::Rose: return "$rose";
        case KnownSystemName::Fell: return "$fell";
        case KnownSystemName::Stable: return "$stable";
        case KnownSystemName::Changed: return "$changed";
        case KnownSystemName::PastGclk: return "$past_gclk";
        case KnownSystemName::RoseGclk: return "$rose_gclk";
        case KnownSystemName::FellGclk: return "$fell_gclk";
        case KnownSystemName::StableGclk: return "$stable_gclk";
        case KnownSystemName::ChangedGclk: return "$changed_gclk";
        case KnownSystemName::FutureGclk: return "$future_gclk";
        case KnownSystemName::RisingGclk: return "$rising_gclk";
        case KnownSystemName::FallingGclk: return "$falling_gclk";
        case KnownSystemName::SteadyGclk: return "$steady_gclk";
        case KnownSystemName::ChangingGclk: return "$changing_gclk";
        case KnownSystemName::Sampled: return "$sampled";
        case KnownSystemName::Past: return "$past";
        case KnownSystemName::Stacktrace: return "$stacktrace";
        case KnownSystemName::CountDrivers: return "$countdrivers";
        case KnownSystemName::GetPattern: return "$getpattern";
        case KnownSystemName::TestPlusArgs: return "$test$plusargs";
        case KnownSystemName::Time: return "$time";
        case KnownSystemName::STime: return "$stime";
        case KnownSystemName::RealTime: return "$realtime";
        case KnownSystemName::Random: return "$random";
        case KnownSystemName::URandom: return "$urandom";
        case KnownSystemName::URandomRange: return "$urandom_range";
        case KnownSystemName::ResetCount: return "$reset_count";
        case KnownSystemName::ResetValue: return "$reset_value";
        case KnownSystemName::TimeUnit: return "$timeunit";
        case KnownSystemName::TimePrecision: return "$timeprecision";
        case KnownSystemName::Scale: return "$scale";
        case KnownSystemName::SdfAnnotate: return "$sdf_annotate";
        case KnownSystemName::DistUniform: return "$dist_uniform";
        case KnownSystemName::DistNormal: return "$dist_normal";
        case KnownSystemName::DistExponential: return "$dist_exponential";
        case KnownSystemName::DistPoisson: return "$dist_poisson";
        case KnownSystemName::DistChiSquare: return "$dist_chi_square";
        case KnownSystemName::DistT: return "$dist_t";
        case KnownSystemName::DistErlang: return "$dist_erlang";
        case KnownSystemName::Fatal: return "$fatal";
        case KnownSystemName::StaticAssert: return "$static_assert";
        case KnownSystemName::Cast: return "$cast";
        case KnownSystemName::Info: return "$info";
        case KnownSystemName::Warning: return "$warning";
        case KnownSystemName::Error: return "$error";
        case KnownSystemName::Finish: return "$finish";
        case KnownSystemName::Stop: return "$stop";
        case KnownSystemName::AssertControl: return "$assertcontrol";
        case KnownSystemName::AssertOn: return "$asserton";
        case KnownSystemName::AssertOff: return "$assertoff";
        case KnownSystemName::AssertKill: return "$assertkill";
        case KnownSystemName::AssertPassOn: return "$assertpasson";
        case KnownSystemName::AssertPassOff: return "$assertpassoff";
        case KnownSystemName::AssertFailOn: return "$assertfailon";
        case KnownSystemName::AssertFailOff: return "$assertfailoff";
        case KnownSystemName::AssertNonvacuousOn: return "$assertnonvacuouson";
        case KnownSystemName::AssertVacuousOff: return "$assertvacuousoff";
        case KnownSystemName::Display: return "$display";
        case KnownSystemName::DisplayB: return "$displayb";
        case KnownSystemName::DisplayO: return "$displayo";
        case KnownSystemName::DisplayH: return "$displayh";
        case KnownSystemName::Write: return "$write";
        case KnownSystemName::WriteB: return "$writeb";
        case KnownSystemName::WriteO: return "$writeo";
        case KnownSystemName::WriteH: return "$writeh";
        case KnownSystemName::Strobe: return "$strobe";
        case KnownSystemName::StrobeB: return "$strobeb";
        case KnownSystemName::StrobeO: return "$strobeo";
        case KnownSystemName::StrobeH: return "$strobeh";
        case KnownSystemName::Monitor: return "$monitor";
        case KnownSystemName::MonitorB: return "$monitorb";
        case KnownSystemName::MonitorO: return "$monitoro";
        case KnownSystemName::MonitorH: return "$monitorh";
        case KnownSystemName::FDisplay: return "$fdisplay";
        case KnownSystemName::FDisplayB: return "$fdisplayb";
        case KnownSystemName::FDisplayO: return "$fdisplayo";
        case KnownSystemName::FDisplayH: return "$fdisplayh";
        case KnownSystemName::FWrite: return "$fwrite";
        case KnownSystemName::FWriteB: return "$fwriteb";
        case KnownSystemName::FWriteO: return "$fwriteo";
        case KnownSystemName::FWriteH: return "$fwriteh";
        case KnownSystemName::FStrobe: return "$fstrobe";
        case KnownSystemName::FStrobeB: return "$fstrobeb";
        case KnownSystemName::FStrobeO: return "$fstrobeo";
        case KnownSystemName::FStrobeH: return "$fstrobeh";
        case KnownSystemName::FMonitor: return "$fmonitor";
        case KnownSystemName::FMonitorB: return "$fmonitorb";
        case KnownSystemName::FMonitorO: return "$fmonitoro";
        case KnownSystemName::FMonitorH: return "$fmonitorh";
        case KnownSystemName::SWrite: return "$swrite";
        case KnownSystemName::SWriteB: return "$swriteb";
        case KnownSystemName::SWriteO: return "$swriteo";
        case KnownSystemName::SWriteH: return "$swriteh";
        case KnownSystemName::SFormat: return "$sformat";
        case KnownSystemName::PrintTimeScale: return "$printtimescale";
        case KnownSystemName::DumpVars: return "$dumpvars";
        case KnownSystemName::DumpPorts: return "$dumpports";
        case KnownSystemName::ShowVars: return "$showvars";
        case KnownSystemName::ReadMemB: return "$readmemb";
        case KnownSystemName::ReadMemH: return "$readmemh";
        case KnownSystemName::WriteMemB: return "$writememb";
        case KnownSystemName::WriteMemH: return "$writememh";
        case KnownSystemName::SReadMemB: return "$sreadmemb";
        case KnownSystemName::SReadMemH: return "$sreadmemh";
        case KnownSystemName::System: return "$system";
        case KnownSystemName::List: return "$list";
        case KnownSystemName::Scope: return "$scope";
        case KnownSystemName::Exit: return "$exit";
        case KnownSystemName::TimeFormat: return "$timeformat";
        case KnownSystemName::MonitorOn: return "$monitoron";
        case KnownSystemName::MonitorOff: return "$monitoroff";
        case KnownSystemName::DumpFile: return "$dumpfile";
        case KnownSystemName::DumpOn: return "$dumpon";
        case KnownSystemName::DumpOff: return "$dumpoff";
        case KnownSystemName::DumpAll: return "$dumpall";
        case KnownSystemName::DumpLimit: return "$dumplimit";
        case KnownSystemName::DumpFlush: return "$dumpflush";
        case KnownSystemName::DumpPortsOn: return "$dumpportson";
        case KnownSystemName::DumpPortsOff: return "$dumpportsoff";
        case KnownSystemName::DumpPortsAll: return "$dumpportsall";
        case KnownSystemName::DumpPortsLimit: return "$dumpportslimit";
        case KnownSystemName::DumpPortsFlush: return "$dumpportsflush";
        case KnownSystemName::Input: return "$input";
        case KnownSystemName::Key: return "$key";
        case KnownSystemName::NoKey: return "$nokey";
        case KnownSystemName::Log: return "$log";
        case KnownSystemName::NoLog: return "$nolog";
        case KnownSystemName::Reset: return "$reset";
        case KnownSystemName::Save: return "$save";
        case KnownSystemName::Restart: return "$restart";
        case KnownSystemName::IncSave: return "$incsave";
        case KnownSystemName::ShowScopes: return "$showscopes";
        case KnownSystemName::QInitialize: return "$q_initialize";
        case KnownSystemName::QAdd: return "$q_add";
        case KnownSystemName::QRemove: return "$q_remove";
        case KnownSystemName::QExam: return "$q_exam";
        case KnownSystemName::QFull: return "$q_full";
        case KnownSystemName::AsyncAndArray: return "$async$and$array";
        case KnownSystemName::SyncAndArray: return "$sync$and$array";
        case KnownSystemName::AsyncAndPlane: return "$async$and$plane";
        case KnownSystemName::SyncAndPlane: return "$sync$and$plane";
        case KnownSystemName::AsyncNandArray: return "$async$nand$array";
        case KnownSystemName::SyncNandArray: return "$sync$nand$array";
        case KnownSystemName::AsyncNandPlane: return "$async$nand$plane";
        case KnownSystemName::SyncNandPlane: return "$sync$nand$plane";
        case KnownSystemName::AsyncOrArray: return "$async$or$array";
        case KnownSystemName::SyncOrArray: return "$sync$or$array";
        case KnownSystemName::AsyncOrPlane: return "$async$or$plane";
        case KnownSystemName::SyncOrPlane: return "$sync$or$plane";
        case KnownSystemName::AsyncNorArray: return "$async$nor$array";
        case KnownSystemName::SyncNorArray: return "$sync$nor$array";
        case KnownSystemName::AsyncNorPlane: return "$async$nor$plane";
        case KnownSystemName::SyncNorPlane: return "$sync$nor$plane";
        case KnownSystemName::Reverse: return "reverse";
        case KnownSystemName::Delete: return "delete";
        case KnownSystemName::Exists: return "exists";
        case KnownSystemName::Insert: return "insert";
        case KnownSystemName::Index: return "index";
        case KnownSystemName::Map: return "map";
        case KnownSystemName::ArraySize: return "size";
        case KnownSystemName::Or: return "or";
        case KnownSystemName::And: return "and";
        case KnownSystemName::XOr: return "xor";
        case KnownSystemName::Sum: return "sum";
        case KnownSystemName::Product: return "product";
        case KnownSystemName::Find: return "find";
        case KnownSystemName::FindIndex: return "find_index";
        case KnownSystemName::FindFirst: return "find_first";
        case KnownSystemName::FindFirstIndex: return "find_first_index";
        case KnownSystemName::FindLast: return "find_last";
        case KnownSystemName::FindLastIndex: return "find_last_index";
        case KnownSystemName::Min: return "min";
        case KnownSystemName::Max: return "max";
        case KnownSystemName::Unique: return "unique";
        case KnownSystemName::UniqueIndex: return "unique_index";
        case KnownSystemName::Sort: return "sort";
        case KnownSystemName::Rsort: return "rsort";
        case KnownSystemName::Shuffle: return "shuffle";
        case KnownSystemName::Num: return "num";
        case KnownSystemName::First: return "first";
        case KnownSystemName::Last: return "last";
        case KnownSystemName::Next: return "next";
        case KnownSystemName::Prev: return "prev";
        case KnownSystemName::PopFront: return "pop_front";
        case KnownSystemName::PopBack: return "pop_back";
        case KnownSystemName::PushFront: return "push_front";
        case KnownSystemName::PushBack: return "push_back";
        case KnownSystemName::Name: return "name";
        case KnownSystemName::Len: return "len";
        case KnownSystemName::Putc: return "putc";
        case KnownSystemName::Getc: return "getc";
        case KnownSystemName::Substr: return "substr";
        case KnownSystemName::ToUpper: return "toupper";
        case KnownSystemName::ToLower: return "tolower";
        case KnownSystemName::Compare: return "compare";
        case KnownSystemName::ICompare: return "icompare";
        case KnownSystemName::AToI: return "atoi";
        case KnownSystemName::AToHex: return "atohex";
        case KnownSystemName::AToOct: return "atooct";
        case KnownSystemName::AToBin: return "atobin";
        case KnownSystemName::AToReal: return "atoreal";
        case KnownSystemName::IToA: return "itoa";
        case KnownSystemName::HexToA: return "hextoa";
        case KnownSystemName::OctToA: return "octtoa";
        case KnownSystemName::BinToA: return "bintoa";
        case KnownSystemName::RealToA: return "realtoa";
        case KnownSystemName::RandMode: return "rand_mode";
        case KnownSystemName::ConstraintMode: return "constraint_mode";
    }
    return "";
}